

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O0

void __thiscall
TPZSYsmpMatrix<long_double>::AddKel
          (TPZSYsmpMatrix<long_double> *this,TPZFMatrix<long_double> *elmat,
          TPZVec<long> *destinationindex)

{
  long index;
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  long *plVar4;
  longdouble *plVar5;
  ostream *poVar6;
  void *this_00;
  TPZVec<long> *in_RDX;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  longdouble in_ST0;
  longdouble lVar7;
  longdouble in_ST1;
  longdouble lVar8;
  longdouble in_ST2;
  longdouble lVar9;
  longdouble in_ST3;
  longdouble lVar10;
  longdouble in_ST4;
  longdouble lVar11;
  longdouble in_ST5;
  longdouble lVar12;
  longdouble in_ST6;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  int flag;
  int64_t jpos;
  int64_t ipos;
  longdouble value;
  int64_t k;
  int64_t j;
  int64_t i;
  undefined8 in_stack_ffffffffffffff32;
  long local_30;
  long local_28;
  long local_20;
  
  local_30 = 0;
  local_20 = 0;
  lVar13 = in_ST6;
  do {
    iVar3 = TPZBaseMatrix::Rows(in_RSI);
    if (iVar3 <= local_20) {
      return;
    }
    for (local_28 = 0; iVar3 = TPZBaseMatrix::Rows(in_RSI), local_28 < iVar3;
        local_28 = local_28 + 1) {
      plVar4 = TPZVec<long>::operator[](in_RDX,local_20);
      index = *plVar4;
      plVar4 = TPZVec<long>::operator[](in_RDX,local_28);
      lVar1 = *plVar4;
      lVar7 = in_ST0;
      lVar8 = in_ST1;
      lVar9 = in_ST2;
      lVar10 = in_ST3;
      lVar11 = in_ST4;
      lVar12 = in_ST5;
      lVar14 = in_ST6;
      lVar15 = lVar13;
      if (index <= lVar1) {
        (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RSI,local_20,local_28);
        lVar15 = lVar13;
        bVar2 = IsZero((longdouble)
                       CONCAT82(in_stack_ffffffffffffff32,(short)((unkuint10)in_ST0 >> 0x40)));
        lVar7 = in_ST1;
        lVar8 = in_ST2;
        lVar9 = in_ST3;
        lVar10 = in_ST4;
        lVar11 = in_ST5;
        lVar12 = in_ST6;
        lVar14 = lVar13;
        if (!bVar2) {
          bVar2 = false;
          local_30 = local_30 + 1;
          plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),index);
          if (((local_30 < *plVar4) ||
              (plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),index + 1),
              *plVar4 <= local_30)) ||
             (plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30),
             *plVar4 != lVar1)) {
            plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),index);
            for (local_30 = *plVar4;
                plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x20),index + 1),
                local_30 < *plVar4; local_30 = local_30 + 1) {
              plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30);
              if ((*plVar4 == lVar1) ||
                 (plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30),
                 *plVar4 == -1)) {
                bVar2 = true;
                plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30);
                if (*plVar4 == -1) {
                  plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_30);
                  *plVar4 = lVar1;
                  plVar5 = TPZVec<long_double>::operator[]
                                     ((TPZVec<long_double> *)(in_RDI + 0x60),local_30);
                  *plVar5 = in_ST0;
                  lVar15 = lVar13;
                }
                else {
                  plVar5 = TPZVec<long_double>::operator[]
                                     ((TPZVec<long_double> *)(in_RDI + 0x60),local_30);
                  *plVar5 = *plVar5 + in_ST0;
                  lVar13 = in_ST6;
                  lVar15 = in_ST6;
                }
                break;
              }
            }
          }
          else {
            plVar5 = TPZVec<long_double>::operator[]
                               ((TPZVec<long_double> *)(in_RDI + 0x60),local_30);
            *plVar5 = *plVar5 + in_ST0;
            bVar2 = true;
            lVar13 = in_ST6;
            lVar15 = in_ST6;
          }
          lVar7 = in_ST1;
          lVar8 = in_ST2;
          lVar9 = in_ST3;
          lVar10 = in_ST4;
          lVar11 = in_ST5;
          lVar12 = in_ST6;
          lVar14 = lVar13;
          if (!bVar2) {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "TPZSYsmpMatrix::AddKel: Non existing position on sparse matrix: line ="
                                    );
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,index);
            poVar6 = std::operator<<(poVar6," column =");
            this_00 = (void *)std::ostream::operator<<(poVar6,lVar1);
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            lVar7 = in_ST1;
            lVar8 = in_ST2;
            lVar9 = in_ST3;
            lVar10 = in_ST4;
            lVar11 = in_ST5;
            lVar12 = in_ST6;
            lVar14 = lVar13;
          }
        }
      }
      in_ST0 = lVar7;
      in_ST1 = lVar8;
      in_ST2 = lVar9;
      in_ST3 = lVar10;
      in_ST4 = lVar11;
      in_ST5 = lVar12;
      in_ST6 = lVar14;
      lVar13 = lVar15;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

void TPZSYsmpMatrix<TVar>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec<int64_t> & destinationindex){
    int64_t i,j,k = 0;
    TVar value=0.;
    int64_t ipos,jpos;
    for(i=0;i<elmat.Rows();i++){
        for(j=0;j<elmat.Rows();j++){
            ipos=destinationindex[i];
            jpos=destinationindex[j];
            if(jpos<ipos) continue;
            value=elmat.GetVal(i,j);
            //cout << "j= " << j << endl;
            if(!IsZero(value)){
                //cout << "fIA[ipos] " << fIA[ipos] << "     fIA[ipos+1] " << fIA[ipos+1] << endl;
                int flag = 0;
				k++;
				if(k >= fIA[ipos] && k < fIA[ipos+1] && fJA[k]==jpos)
				{ // OK -> elements in sequence
					fA[k]+=value;
					flag = 1;
				}else
				{
					for(k=fIA[ipos];k<fIA[ipos+1];k++){
						if(fJA[k]==jpos || fJA[k]==-1){
							//cout << "fJA[k] " << fJA[k] << " jpos "<< jpos << "   " << value << endl;
							//cout << "k " << k << "   "<< jpos << "   " << value << endl;
							flag=1;
							if(fJA[k]==-1){
								fJA[k]=jpos;
								fA[k]=value;
								// cout << jpos << "   " << value << endl;
								break;
							}else{
								fA[k]+=value;
								break;
							}
						}
					}
				}
                if(!flag) std::cout << "TPZSYsmpMatrix::AddKel: Non existing position on sparse matrix: line =" << ipos << " column =" << jpos << std::endl;         }
        }
    }
}